

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_str.c
# Opt level: O2

char * ck_strdup_printf(char *fmt,...)

{
  char in_AL;
  int iVar1;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t __maxlen;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  __maxlen = 100;
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  __s = (char *)emalloc(100);
  while( true ) {
    ap[0].reg_save_area = local_e8;
    ap[0].gp_offset = 8;
    ap[0].fp_offset = 0x30;
    ap[0].overflow_arg_area = &stack0x00000008;
    iVar1 = vsnprintf(__s,__maxlen,fmt,ap);
    if (-1 < iVar1 && iVar1 < (int)__maxlen) break;
    __maxlen = __maxlen * 2;
    if (-1 < iVar1) {
      __maxlen = (ulong)(iVar1 + 1);
    }
    __s = (char *)erealloc(__s,__maxlen);
  }
  return __s;
}

Assistant:

char *ck_strdup_printf(const char *fmt, ...)
{
    /* Guess we need no more than 100 bytes. */
    size_t size = 100;
    char *p;
    va_list ap;

    p = (char *)emalloc(size);

    while(1)
    {
        int n;
        /* Try to print in the allocated space. */
        va_start(ap, fmt);
        n = vsnprintf(p, size, fmt, ap);
        va_end(ap);
        /* If that worked, return the string. */
        if(n > -1 && n < (int)size)
            return p;

        /* Else try again with more space. */
        if(n > -1)              /* C99 conform vsnprintf() */
            size = (size_t) n + 1;      /* precisely what is needed */
        else                    /* glibc 2.0 */
            size *= 2;          /* twice the old size */

        p = (char *)erealloc(p, size);
    }
}